

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O3

int ifstream_readTextFileFromHandle(ifstream_t *self,FILE *fh)

{
  _func_void_void_ptr *p_Var1;
  _func_void_void_ptr_uint8_t_ptr_uint32_t *p_Var2;
  char *__s;
  uint8_t *__dest;
  char *pcVar3;
  size_t __n;
  int *piVar4;
  int iVar5;
  uint32_t uVar6;
  
  if (fh == (FILE *)0x0 || self == (ifstream_t *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar5 = -1;
  }
  else {
    __s = (char *)malloc(0x2000);
    __dest = (uint8_t *)malloc(0x2000);
    if (__dest != (uint8_t *)0x0 && __s != (char *)0x0) {
      p_Var1 = (self->handler).open;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        (*p_Var1)((self->handler).arg);
      }
      pcVar3 = fgets(__s,0x2000,(FILE *)fh);
      if (pcVar3 != (char *)0x0) {
        uVar6 = 0;
        do {
          __n = strlen(__s);
          if (__n != 1) {
            if (__n == 0) {
              __assert_fail("len>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/filestream.c"
                            ,0x95,"int ifstream_readTextFileFromHandle(ifstream_t *, FILE *)");
            }
            if (__s[__n - 2] == '\r') {
              __s[__n - 2] = '\n';
              __n = __n - 1;
            }
          }
          if (uVar6 + __n < 0x2000) {
            memcpy(__dest + uVar6,__s,__n);
            uVar6 = uVar6 + (uint32_t)__n;
          }
          else {
            p_Var2 = (self->handler).write;
            if (p_Var2 != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0) {
              (*p_Var2)((self->handler).arg,__dest,uVar6);
            }
            memcpy(__dest,__s,__n);
            uVar6 = (uint32_t)__n;
          }
          pcVar3 = fgets(__s,0x2000,(FILE *)fh);
        } while (pcVar3 != (char *)0x0);
        if ((uVar6 != 0) &&
           (p_Var2 = (self->handler).write,
           p_Var2 != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0)) {
          (*p_Var2)((self->handler).arg,__dest,uVar6);
        }
      }
      p_Var1 = (self->handler).close;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        (*p_Var1)((self->handler).arg);
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
    iVar5 = 0;
    if (__dest != (uint8_t *)0x0) {
      free(__dest);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int ifstream_readTextFileFromHandle(ifstream_t *self, FILE *fh)
{
   int retval = 0;
   if( (self != 0) && (fh != 0) ){
      uint32_t chunkLen = 0;
      char *buf;
      char *chunk;
      buf = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      chunk = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      if( (buf != 0) && (chunk != 0) )
      {
         if(self->handler.open != 0)
         {
            self->handler.open(self->handler.arg);
         }

         while(fgets(buf, IFSTREAM_BLOCK_SIZE, fh) != NULL)
         {
            size_t len = strlen(buf);
            assert(len>0);
            //dos2unix file ending
            if( (len>=2) && buf[len-2] == '\r')
            {
               len--;
               buf[len-1]='\n';
            }
            if(len+chunkLen < IFSTREAM_BLOCK_SIZE)
            {
               memcpy(&chunk[chunkLen],buf,len);
               chunkLen += (uint32_t) len;
            }
            else
            {
               if(self->handler.write != 0)
               {
                  self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
               }
               memcpy(&chunk[0],buf,len);
               chunkLen = (uint32_t) len;
            }
         }
         if( (chunkLen > 0) && (self->handler.write != 0))
         {
            self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
         }
         if(self->handler.close != 0)
         {
            self->handler.close(self->handler.arg);
         }
      }
      if (buf != 0) free(buf);
      if (chunk != 0) free(chunk);
   }
   else
   {
      errno = EINVAL;
      retval = -1;
   }
   return retval;
}